

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManDivCreate(Fxch_Man_t *pFxchMan)

{
  size_t sVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  uint uVar5;
  Vec_Que_t *pVVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  long lVar10;
  Vec_Flt_t *pVVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  
  if (0 < pFxchMan->vCubes->nSize) {
    iVar12 = 0;
    do {
      Fxch_ManDivSingleCube(pFxchMan,iVar12,1,0);
      Fxch_ManDivDoubleCube(pFxchMan,iVar12,1,0);
      iVar12 = iVar12 + 1;
    } while (iVar12 < pFxchMan->vCubes->nSize);
  }
  pVVar11 = pFxchMan->vDivWeights;
  uVar13 = pVVar11->nSize;
  pVVar6 = (Vec_Que_t *)calloc(1,0x20);
  uVar7 = 0x10;
  if (0x10 < (int)uVar13) {
    uVar7 = (ulong)uVar13;
  }
  pVVar6->nSize = 1;
  pVVar6->nCap = (int)uVar7 + 1;
  sVar1 = uVar7 * 4 + 4;
  piVar8 = (int *)malloc(sVar1);
  memset(piVar8,0xff,sVar1);
  pVVar6->pHeap = piVar8;
  piVar8 = (int *)malloc(sVar1);
  memset(piVar8,0xff,sVar1);
  pVVar6->pOrder = piVar8;
  pFxchMan->vDivPrio = pVVar6;
  pVVar6->pCostsFlt = &pVVar11->pArray;
  if (0 < pVVar11->nSize) {
    uVar7 = 0;
    do {
      if (0.0 < pVVar11->pArray[uVar7]) {
        pVVar6 = pFxchMan->vDivPrio;
        uVar13 = pVVar6->nCap;
        if (pVVar6->nSize < (int)uVar13) {
          lVar10 = (long)(int)uVar13;
        }
        else {
          uVar5 = pVVar6->nSize + 1;
          uVar14 = uVar13 * 2;
          iVar12 = uVar13 * -2;
          uVar13 = uVar14;
          if (uVar5 != uVar14 && SBORROW4(uVar5,uVar14) == (int)(uVar5 + iVar12) < 0) {
            uVar13 = uVar5;
          }
          lVar10 = (long)(int)uVar13;
          sVar1 = lVar10 * 4;
          if (pVVar6->pHeap == (int *)0x0) {
            piVar8 = (int *)malloc(sVar1);
          }
          else {
            piVar8 = (int *)realloc(pVVar6->pHeap,sVar1);
          }
          pVVar6->pHeap = piVar8;
          if (pVVar6->pOrder == (int *)0x0) {
            piVar9 = (int *)malloc(sVar1);
          }
          else {
            piVar9 = (int *)realloc(pVVar6->pOrder,sVar1);
            piVar8 = pVVar6->pHeap;
          }
          pVVar6->pOrder = piVar9;
          memset(piVar8 + pVVar6->nCap,0xff,((long)(int)uVar13 - (long)pVVar6->nCap) * 4);
          memset(pVVar6->pOrder + pVVar6->nCap,0xff,((long)(int)uVar13 - (long)pVVar6->nCap) * 4);
          pVVar6->nCap = uVar13;
        }
        iVar12 = (int)uVar7;
        if (lVar10 <= (long)uVar7) {
          uVar14 = uVar13 * 2;
          uVar5 = iVar12 + 1;
          iVar2 = uVar13 * -2;
          uVar13 = uVar14;
          if (uVar5 != uVar14 && SBORROW4(uVar5,uVar14) == (int)(uVar5 + iVar2) < 0) {
            uVar13 = uVar5;
          }
          sVar1 = (ulong)uVar13 * 4;
          if (pVVar6->pHeap == (int *)0x0) {
            piVar8 = (int *)malloc(sVar1);
          }
          else {
            piVar8 = (int *)realloc(pVVar6->pHeap,sVar1);
          }
          pVVar6->pHeap = piVar8;
          if (pVVar6->pOrder == (int *)0x0) {
            piVar9 = (int *)malloc(sVar1);
          }
          else {
            piVar9 = (int *)realloc(pVVar6->pOrder,sVar1);
            piVar8 = pVVar6->pHeap;
          }
          pVVar6->pOrder = piVar9;
          memset(piVar8 + pVVar6->nCap,0xff,((long)(int)uVar13 - (long)pVVar6->nCap) * 4);
          memset(pVVar6->pOrder + pVVar6->nCap,0xff,((long)(int)uVar13 - (long)pVVar6->nCap) * 4);
          pVVar6->nCap = uVar13;
        }
        iVar2 = pVVar6->nSize;
        if ((int)uVar13 <= iVar2) {
          __assert_fail("p->nSize < p->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar8 = pVVar6->pOrder;
        if (piVar8[uVar7] != -1) {
          __assert_fail("p->pOrder[v] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar9 = pVVar6->pHeap;
        if (piVar9[iVar2] != -1) {
          __assert_fail("p->pHeap[p->nSize] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar8[uVar7] = iVar2;
        iVar2 = pVVar6->nSize;
        pVVar6->nSize = iVar2 + 1;
        piVar9[iVar2] = iVar12;
        pfVar3 = *pVVar6->pCostsFlt;
        if (pfVar3 == (float *)0x0) {
          fVar16 = (float)iVar12;
        }
        else {
          fVar16 = pfVar3[uVar7];
        }
        uVar13 = piVar8[uVar7];
        uVar15 = (ulong)(int)uVar13;
        if (uVar15 == 0xffffffffffffffff) {
          __assert_fail("p->pOrder[v] != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        if (uVar7 != (uint)piVar9[uVar15]) {
          __assert_fail("p->pHeap[i] == v",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
        }
        if (1 < (int)uVar13) {
          do {
            uVar14 = uVar13 >> 1;
            iVar2 = piVar9[uVar14];
            if (pfVar3 == (float *)0x0) {
              fVar17 = (float)iVar2;
            }
            else {
              fVar17 = pfVar3[iVar2];
            }
            uVar15 = (ulong)uVar13;
            if (fVar16 <= fVar17) break;
            piVar9[uVar13] = iVar2;
            piVar8[iVar2] = uVar13;
            bVar4 = 3 < uVar13;
            uVar15 = (ulong)uVar14;
            uVar13 = uVar14;
          } while (bVar4);
        }
        piVar9[uVar15] = iVar12;
        piVar8[uVar7] = uVar13;
        pVVar11 = pFxchMan->vDivWeights;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)pVVar11->nSize);
  }
  return;
}

Assistant:

void Fxch_ManDivCreate( Fxch_Man_t* pFxchMan )
{
    Vec_Int_t* vCube;
    float Weight;
    int fAdd = 1,
        fUpdate = 0,
        iCube;

    Vec_WecForEachLevel( pFxchMan->vCubes, vCube, iCube )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube, fAdd, fUpdate );
        Fxch_ManDivDoubleCube( pFxchMan, iCube, fAdd, fUpdate );
    }

    pFxchMan->vDivPrio = Vec_QueAlloc( Vec_FltSize( pFxchMan->vDivWeights ) );
    Vec_QueSetPriority( pFxchMan->vDivPrio, Vec_FltArrayP( pFxchMan->vDivWeights ) );
    Vec_FltForEachEntry( pFxchMan->vDivWeights, Weight, iCube )
    {
        if ( Weight > 0.0 )
            Vec_QuePush( pFxchMan->vDivPrio, iCube );
    }
}